

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program.cpp
# Opt level: O0

bool __thiscall Clasp::Asp::LogicProgram::isFact(LogicProgram *this,PrgAtom *a)

{
  bool bVar1;
  ValueRep VVar2;
  weight_t wVar3;
  LogicProgram *this_00;
  LogicProgram *this_01;
  PrgNode *in_RSI;
  undefined8 in_RDI;
  sup_iterator end;
  sup_iterator it;
  uint32 eqId;
  LogicProgram *in_stack_ffffffffffffffd0;
  bool local_1;
  
  PrgNode::id(in_RSI);
  getRootId(in_stack_ffffffffffffffd0,(Id_t)((ulong)in_RDI >> 0x20));
  bVar1 = AtomState::isFact((AtomState *)in_stack_ffffffffffffffd0,(Var)((ulong)in_RDI >> 0x20));
  if (bVar1) {
    local_1 = true;
  }
  else {
    VVar2 = PrgNode::value(in_RSI);
    if (VVar2 == '\x01') {
      this_00 = (LogicProgram *)PrgHead::supps_begin((PrgHead *)0x17d4a4);
      this_01 = (LogicProgram *)PrgHead::supps_end((PrgHead *)0x17d4b3);
      for (; this_00 != this_01;
          this_00 = (LogicProgram *)
                    ((long)&(this_00->super_ProgramBuilder)._vptr_ProgramBuilder + 4)) {
        bVar1 = PrgEdge::isBody((PrgEdge *)0x17d4ce);
        if ((bVar1) && (bVar1 = PrgEdge::isNormal((PrgEdge *)this_00), bVar1)) {
          PrgEdge::node((PrgEdge *)this_00);
          getBody(this_01,(Id_t)((ulong)in_RDI >> 0x20));
          wVar3 = PrgBody::bound((PrgBody *)this_00);
          if (wVar3 == 0) {
            return true;
          }
        }
      }
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool LogicProgram::isFact(PrgAtom* a) const {
	uint32 eqId = getRootId(a->id());
	if (atomState_.isFact(eqId)) {
		return true;
	}
	if (a->value() == value_true) {
		for (PrgAtom::sup_iterator it = a->supps_begin(), end = a->supps_end(); it != end; ++it) {
			if (it->isBody() && it->isNormal() && getBody(it->node())->bound() == 0) {
				return true;
			}
		}
	}
	return false;
}